

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::GRULayerParams::ByteSizeLong(GRULayerParams *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ActivationParams *value;
  size_t sVar4;
  uint64 uVar5;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  GRULayerParams *this_local;
  
  uVar2 = activations_size(this);
  _i = (size_t)uVar2;
  for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
    value = activations(this,local_20);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ActivationParams>(value);
    _i = sVar4 + _i;
  }
  bVar1 = has_updategateweightmatrix(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->updategateweightmatrix_)
    ;
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_resetgateweightmatrix(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->resetgateweightmatrix_);
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_outputgateweightmatrix(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->outputgateweightmatrix_)
    ;
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_updategaterecursionmatrix(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->updategaterecursionmatrix_);
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_resetgaterecursionmatrix(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->resetgaterecursionmatrix_);
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_outputgaterecursionmatrix(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>
                      (this->outputgaterecursionmatrix_);
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_updategatebiasvector(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->updategatebiasvector_);
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_resetgatebiasvector(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->resetgatebiasvector_);
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_outputgatebiasvector(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::WeightParams>(this->outputgatebiasvector_);
    _i = sVar4 + 2 + _i;
  }
  uVar5 = inputvectorsize(this);
  if (uVar5 != 0) {
    uVar5 = inputvectorsize(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar5);
    _i = sVar4 + 1 + _i;
  }
  uVar5 = outputvectorsize(this);
  if (uVar5 != 0) {
    uVar5 = outputvectorsize(this);
    sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar5);
    _i = sVar4 + 1 + _i;
  }
  bVar1 = sequenceoutput(this);
  if (bVar1) {
    _i = _i + 2;
  }
  bVar1 = hasbiasvectors(this);
  if (bVar1) {
    _i = _i + 3;
  }
  bVar1 = reverseinput(this);
  if (bVar1) {
    _i = _i + 3;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t GRULayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GRULayerParams)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  {
    unsigned int count = this->activations_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activations(i));
    }
  }

  // .CoreML.Specification.WeightParams updateGateWeightMatrix = 30;
  if (this->has_updategateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams resetGateWeightMatrix = 31;
  if (this->has_resetgateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateWeightMatrix = 32;
  if (this->has_outputgateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams updateGateRecursionMatrix = 50;
  if (this->has_updategaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams resetGateRecursionMatrix = 51;
  if (this->has_resetgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 52;
  if (this->has_outputgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams updateGateBiasVector = 70;
  if (this->has_updategatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategatebiasvector_);
  }

  // .CoreML.Specification.WeightParams resetGateBiasVector = 71;
  if (this->has_resetgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgatebiasvector_);
  }

  // .CoreML.Specification.WeightParams outputGateBiasVector = 72;
  if (this->has_outputgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgatebiasvector_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    total_size += 2 + 1;
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}